

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Matrix * MatrixTranspose(Matrix *a)

{
  undefined1 value [16];
  Matrix *a_00;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  unkbyte10 Var1;
  undefined6 in_stack_ffffffffffffffc2;
  uint local_20;
  uint local_1c;
  uint32_t col;
  uint32_t row;
  Matrix *new;
  Matrix *a_local;
  
  a_00 = MatrixZero(a->columns,a->rows);
  for (local_1c = 0; local_1c < a->columns; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < a->rows; local_20 = local_20 + 1) {
      MatrixGetElement((Real *)a,(Matrix *)(ulong)local_20,local_1c,(uint32_t)a);
      value._10_6_ = in_stack_ffffffffffffffc2;
      value._0_10_ = in_ST0;
      Var1 = in_ST7;
      MatrixSetElement(a_00,local_1c,local_20,(Real)value);
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
      in_ST7 = Var1;
    }
  }
  return a_00;
}

Assistant:

Matrix *MatrixTranspose(const Matrix *a) {
  Matrix *new = MatrixZero(a->columns, a->rows);
  for (uint32_t row = 0; row < a->columns; ++row) {
    for (uint32_t col = 0; col < a->rows; ++col) {
      MatrixSetElement(new, row, col, MatrixGetElement(a, col, row));
    }
  }
  return new;
}